

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O2

bool __thiscall
ONX_ModelTest::ReadTest
          (ONX_ModelTest *this,char *file_path,Type test_type,bool bKeepModels,
          char *text_log_file_path,ON_TextLog *text_log)

{
  uint *puVar1;
  bool bVar2;
  int iVar3;
  FILE *fp;
  wchar_t *pwVar4;
  ON_wString wide_text_log_file_path;
  ON_TextLogNull devnull;
  ON_BinaryFile archive;
  
  Internal_BeginTest(this);
  this->m_test_type = test_type;
  ON_TextLogNull::ON_TextLogNull(&devnull);
  if (text_log == (ON_TextLog *)0x0) {
    text_log = &ON_TextLog::Null;
  }
  if ((file_path == (char *)0x0) || (*file_path == '\0')) {
    this->m_error_counts[0].m_failure_count = this->m_error_counts[0].m_failure_count + 1;
    ON_TextLog::Print(text_log,"file_path was the empty string.");
  }
  else {
    fp = ON_FileStream::Open3dmToRead(file_path);
    if (fp == (FILE *)0x0) {
      this->m_error_counts[0].m_failure_count = this->m_error_counts[0].m_failure_count + 1;
      ON_TextLog::Print(text_log,"ON_FileStream::Open(%s, \"rb\") failed.",file_path);
    }
    else {
      ON_BinaryFile::ON_BinaryFile(&archive,read3dm,fp);
      ON_wString::ON_wString(&wide_text_log_file_path,file_path);
      pwVar4 = ON_wString::operator_cast_to_wchar_t_(&wide_text_log_file_path);
      ON_BinaryArchive::SetArchiveFullPath(&archive.super_ON_BinaryArchive,pwVar4);
      ON_wString::~ON_wString(&wide_text_log_file_path);
      ON_wString::ON_wString(&wide_text_log_file_path,text_log_file_path);
      pwVar4 = ON_wString::operator_cast_to_wchar_t_(&wide_text_log_file_path);
      Internal_ReadTest(this,&archive.super_ON_BinaryArchive,test_type,bKeepModels,pwVar4,text_log);
      ON_wString::~ON_wString(&wide_text_log_file_path);
      ON_BinaryFile::~ON_BinaryFile(&archive);
      iVar3 = ON_FileStream::Close(fp);
      if (iVar3 != 0) {
        ON_TextLog::Print(text_log,"ON_FileStream::Close(%s) failed.",file_path);
        puVar1 = &this->m_error_counts[0].m_error_count;
        *puVar1 = *puVar1 + 1;
      }
    }
  }
  bVar2 = Internal_TallyTestResults(this);
  ON_TextLog::~ON_TextLog(&devnull.super_ON_TextLog);
  return bVar2;
}

Assistant:

bool ONX_ModelTest::ReadTest(
    const char* file_path,
    ONX_ModelTest::Type test_type,
    bool bKeepModels,
    const char* text_log_file_path,
    ON_TextLog* text_log
)
{
  Internal_BeginTest();

  m_test_type = test_type;

  ON_TextLogNull devnull;
  if (nullptr == text_log)
    text_log = &ON_TextLog::Null;

  FILE* fp = nullptr;
  for (;;)
  {
    if (nullptr == file_path || 0 == file_path[0])
    {
      m_error_counts[0].IncrementFailureCount();
      text_log->Print("file_path was the empty string.");
      break;
    }

    fp = ON_FileStream::Open3dmToRead(file_path);
    if (nullptr == fp)
    {
      m_error_counts[0].IncrementFailureCount();
      text_log->Print("ON_FileStream::Open(%s, \"rb\") failed.",file_path);
      break;
    }

    ON_BinaryFile archive(ON::archive_mode::read3dm, fp);
    archive.SetArchiveFullPath(ON_wString(file_path));

    ON_wString wide_text_log_file_path(text_log_file_path);
    Internal_ReadTest(archive, test_type, bKeepModels, wide_text_log_file_path, text_log);
    break;
  }

  if (nullptr != fp)
  {
    if (0 != ON_FileStream::Close(fp))
    {
      text_log->Print("ON_FileStream::Close(%s) failed.", file_path);
      m_error_counts[0].IncrementErrorCount();
    }
  }

  return Internal_TallyTestResults();
}